

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O0

unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
__thiscall
duckdb::EnumColumnWriter::InitializePageState
          (EnumColumnWriter *this,PrimitiveColumnWriterState *state,idx_t page_idx)

{
  uint *in_RDX;
  _Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false> in_RDI;
  _Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false> this_00;
  
  this_00._M_head_impl = in_RDI._M_head_impl;
  make_uniq<duckdb::EnumWriterPageState,unsigned_int&>(in_RDX);
  unique_ptr<duckdb::ColumnWriterPageState,std::default_delete<duckdb::ColumnWriterPageState>,true>
  ::
  unique_ptr<duckdb::EnumWriterPageState,std::default_delete<std::unique_ptr<duckdb::ColumnWriterPageState,std::default_delete<duckdb::ColumnWriterPageState>>>,void>
            ((unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
              *)this_00._M_head_impl,
             (unique_ptr<duckdb::EnumWriterPageState,_std::default_delete<duckdb::EnumWriterPageState>_>
              *)in_RDI._M_head_impl);
  unique_ptr<duckdb::EnumWriterPageState,_std::default_delete<duckdb::EnumWriterPageState>,_true>::
  ~unique_ptr((unique_ptr<duckdb::EnumWriterPageState,_std::default_delete<duckdb::EnumWriterPageState>,_true>
               *)0x86a77f);
  return (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
          )(_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )this_00._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriterPageState> EnumColumnWriter::InitializePageState(PrimitiveColumnWriterState &state,
                                                                        idx_t page_idx) {
	return make_uniq<EnumWriterPageState>(bit_width);
}